

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

Elem * new_string(Grammar *g,char *s,char *e,Rule *r)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  Term *pTVar4;
  ushort *puVar5;
  uint uVar6;
  Elem *pEVar7;
  ushort **ppuVar8;
  long lVar9;
  size_t sVar10;
  uint uVar11;
  char *__nptr;
  int __base;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  
  pEVar7 = new_term_string(g,s + 1,e + -1,r);
  *(uint *)&((pEVar7->e).nterm)->name = (uint)(*s == '\"');
  pTVar4 = (pEVar7->e).term;
  pcVar13 = pTVar4->string;
  __base = 0;
  pcVar12 = (char *)0x0;
  pcVar14 = pcVar13;
  do {
    cVar1 = *pcVar14;
    if (cVar1 != '\\') {
      if (cVar1 == '\0') {
        *pcVar13 = '\0';
        pcVar13 = pTVar4->string;
        sVar10 = strlen(pcVar13);
        pTVar4->string_len = (int)sVar10;
        if ((int)sVar10 != 0) {
          return pEVar7;
        }
        d_fail("empty string after unescape \'%s\'",pcVar13);
        return pEVar7;
      }
      *pcVar13 = cVar1;
      __nptr = pcVar12;
      goto LAB_00138ab5;
    }
    __nptr = pcVar14 + 1;
    bVar2 = pcVar14[1];
    if (bVar2 < 0x5c) {
      if (7 < bVar2 - 0x30) {
        if (bVar2 == 0x22) {
          if (pTVar4->kind != TERM_REGEX) goto switchD_001388b4_caseD_65;
          *pcVar13 = '\"';
          pcVar14 = __nptr;
          __nptr = pcVar12;
        }
        else {
          if ((bVar2 != 0x27) || (pTVar4->kind != TERM_STRING)) goto switchD_001388b4_caseD_65;
          *pcVar13 = '\'';
          pcVar14 = __nptr;
          __nptr = pcVar12;
        }
        goto LAB_00138ab5;
      }
      ppuVar8 = __ctype_b_loc();
      __base = 8;
      uVar11 = 1;
      if (((pcVar14[2] & 0xfeU) == 0x38) || (((*ppuVar8)[(byte)pcVar14[2]] & 0x800) == 0)) {
        uVar6 = 1;
      }
      else {
        uVar11 = ((pcVar14[3] & 0xfeU) == 0x38 ||
                 (*(byte *)((long)*ppuVar8 + (ulong)(byte)pcVar14[3] * 2 + 1) & 8) == 0) ^ 3;
        uVar6 = uVar11;
      }
      goto LAB_00138a32;
    }
    switch(bVar2) {
    case 0x61:
      *pcVar13 = '\a';
      pcVar14 = __nptr;
      __nptr = pcVar12;
      break;
    case 0x62:
      *pcVar13 = '\b';
      pcVar14 = __nptr;
      __nptr = pcVar12;
      break;
    case 99:
      *pcVar13 = '\0';
      return pEVar7;
    case 100:
      ppuVar8 = __ctype_b_loc();
      puVar5 = *ppuVar8;
      bVar2 = pcVar14[2];
      uVar6 = 0;
      __nptr = pcVar12;
      if ((*(byte *)((long)puVar5 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
        __nptr = pcVar14 + 2;
        bVar3 = pcVar14[3];
        __base = 10;
        uVar6 = 1;
        if ((*(byte *)((long)puVar5 + (ulong)bVar3 * 2 + 1) & 8) != 0) {
          uVar6 = 2;
          if (((*(byte *)((long)puVar5 + (ulong)(byte)pcVar14[4] * 2 + 1) & 8) != 0) &&
             (((char)bVar2 < '2' ||
              ((bVar2 == 0x32 && (((char)bVar3 < '5' || (pcVar14[4] < '6' && bVar3 == 0x35)))))))) {
            uVar6 = 3;
          }
        }
      }
      goto LAB_00138a2c;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_001388b4_caseD_65:
      __nptr = pcVar12;
      goto LAB_00138a9a;
    case 0x66:
      *pcVar13 = '\f';
      pcVar14 = __nptr;
      __nptr = pcVar12;
      break;
    case 0x6e:
      *pcVar13 = '\n';
      pcVar14 = __nptr;
      __nptr = pcVar12;
      break;
    case 0x72:
      *pcVar13 = '\r';
      pcVar14 = __nptr;
      __nptr = pcVar12;
      break;
    case 0x74:
      *pcVar13 = '\t';
      pcVar14 = __nptr;
      __nptr = pcVar12;
      break;
    case 0x76:
      *pcVar13 = '\v';
      pcVar14 = __nptr;
      __nptr = pcVar12;
      break;
    case 0x78:
      ppuVar8 = __ctype_b_loc();
      uVar6 = 0;
      __nptr = pcVar12;
      if ((*(byte *)((long)*ppuVar8 + (ulong)(byte)pcVar14[2] * 2 + 1) & 0x10) != 0) {
        uVar6 = 2 - ((*(byte *)((long)*ppuVar8 + (ulong)(byte)pcVar14[3] * 2 + 1) & 0x10) == 0);
        __base = 0x10;
        __nptr = pcVar14 + 2;
      }
LAB_00138a2c:
      uVar11 = uVar6 + 1;
LAB_00138a32:
      pcVar14 = pcVar14 + uVar11;
      if (0 < (int)uVar6) {
        cVar1 = __nptr[uVar6];
        __nptr[uVar6] = '\0';
        lVar9 = strtol(__nptr,(char **)0x0,__base);
        *pcVar13 = (char)lVar9;
        __nptr[uVar6] = cVar1;
        if (*pcVar14 < '\x01') {
          d_fail("encountered an escaped NULL while processing \'%s\'");
LAB_00138a9a:
          *pcVar13 = *pcVar14;
          pcVar13[1] = pcVar14[1];
          pcVar13 = pcVar13 + 1;
          pcVar14 = pcVar14 + 1;
        }
        break;
      }
      goto LAB_00138abb;
    default:
      if ((bVar2 != 0x5c) || (pTVar4->kind != TERM_STRING)) goto switchD_001388b4_caseD_65;
      *pcVar13 = '\\';
      pcVar14 = __nptr;
      __nptr = pcVar12;
    }
LAB_00138ab5:
    pcVar13 = pcVar13 + 1;
LAB_00138abb:
    pcVar14 = pcVar14 + 1;
    pcVar12 = __nptr;
  } while( true );
}

Assistant:

Elem *new_string(Grammar *g, char *s, char *e, Rule *r) {
  Elem *x = new_term_string(g, s + 1, e - 1, r);
  x->e.term->kind = (*s == '"') ? TERM_REGEX : TERM_STRING;
  unescape_term_string(x->e.term);
  return x;
}